

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::
write_pointer<unsigned_long>
          (basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_> *this,unsigned_long value,
          format_specs *specs)

{
  pointer_writer<unsigned_long> pw;
  format_specs specs_copy;
  pointer_writer<unsigned_long> local_58;
  checked_ptr<typename_buffer<wchar_t>::value_type> local_48;
  ulong uStack_40;
  wchar_t local_38 [2];
  wchar_t awStack_30 [6];
  
  local_58.num_digits = count_digits<4u,unsigned_long>(value);
  local_58.value = value;
  if (specs == (format_specs *)0x0) {
    local_48 = reserve<duckdb_fmt::v6::internal::buffer<wchar_t>,_0>
                         (&this->out_,(ulong)(local_58.num_digits + 2));
    basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::pointer_writer<unsigned_long>::operator()
              ((pointer_writer<unsigned_long> *)&local_58,&local_48);
  }
  else {
    local_48 = *(checked_ptr<typename_buffer<wchar_t>::value_type> *)specs;
    uStack_40._0_1_ = specs->type;
    uStack_40._1_3_ = *(undefined3 *)&specs->field_0x9;
    uStack_40._4_4_ = (specs->fill).data_[0];
    local_38 = *(wchar_t (*) [2])((specs->fill).data_ + 1);
    awStack_30._0_8_ = *(undefined8 *)((specs->fill).data_ + 3);
    awStack_30._8_8_ = *(undefined8 *)((specs->fill).data_ + 5);
    if ((uStack_40 & 0xf00) == 0) {
      uStack_40 = uStack_40 | 0x200;
    }
    basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
    write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::pointer_writer<unsigned_long>&>
              ((basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *)this,(format_specs *)&local_48
               ,&local_58);
  }
  return;
}

Assistant:

void write_pointer(UIntPtr value, const format_specs* specs) {
    int num_digits = count_digits<4>(value);
    auto pw = pointer_writer<UIntPtr>{value, num_digits};
    if (!specs) return pw(reserve(to_unsigned(num_digits) + 2));
    format_specs specs_copy = *specs;
    if (specs_copy.align == align::none) specs_copy.align = align::right;
    write_padded(specs_copy, pw);
  }